

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

box3f * __thiscall
pbrt::Curve::getPrimBounds(box3f *__return_storage_ptr__,Curve *this,size_t param_1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  undefined4 uVar7;
  ulong uVar5;
  undefined4 uVar8;
  undefined4 uVar9;
  pointer pvVar10;
  pointer pvVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  (__return_storage_ptr__->lower).x = 3.4028235e+38;
  (__return_storage_ptr__->lower).y = 3.4028235e+38;
  *(undefined8 *)&(__return_storage_ptr__->lower).z = 0xff7fffff7f7fffff;
  (__return_storage_ptr__->upper).y = -3.4028235e+38;
  (__return_storage_ptr__->upper).z = -3.4028235e+38;
  pvVar11 = (this->P).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pvVar10 = (this->P).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  fVar13 = (__return_storage_ptr__->lower).z;
  if (pvVar11 == pvVar10) {
    fVar15 = -3.4028235e+38;
  }
  else {
    uVar1 = (__return_storage_ptr__->lower).x;
    uVar6 = (__return_storage_ptr__->lower).y;
    auVar19._4_4_ = uVar6;
    auVar19._0_4_ = uVar1;
    auVar19._8_8_ = 0;
    uVar2 = (__return_storage_ptr__->upper).x;
    uVar7 = (__return_storage_ptr__->upper).y;
    auVar17._4_4_ = uVar7;
    auVar17._0_4_ = uVar2;
    auVar17._8_8_ = 0;
    fVar12 = fVar13;
    fVar14 = -3.4028235e+38;
    do {
      fVar15 = pvVar11->z;
      uVar5._0_4_ = pvVar11->x;
      uVar5._4_4_ = pvVar11->y;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar5;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar5;
      auVar19 = minps(auVar18,auVar19);
      fVar13 = fVar15;
      if (fVar12 <= fVar15) {
        fVar13 = fVar12;
      }
      auVar17 = maxps(auVar16,auVar17);
      if (fVar15 <= fVar14) {
        fVar15 = fVar14;
      }
      pvVar11 = pvVar11 + 1;
      fVar12 = fVar13;
      fVar14 = fVar15;
    } while (pvVar11 != pvVar10);
    (__return_storage_ptr__->lower).x = (float)(int)auVar19._0_8_;
    (__return_storage_ptr__->lower).y = (float)(int)((ulong)auVar19._0_8_ >> 0x20);
    (__return_storage_ptr__->upper).x = (float)(int)auVar17._0_8_;
    (__return_storage_ptr__->upper).y = (float)(int)((ulong)auVar17._0_8_ >> 0x20);
  }
  (__return_storage_ptr__->lower).z = fVar13;
  (__return_storage_ptr__->upper).z = fVar15;
  fVar12 = this->width1;
  if (this->width1 <= this->width0) {
    fVar12 = this->width0;
  }
  uVar3 = (__return_storage_ptr__->lower).x;
  uVar8 = (__return_storage_ptr__->lower).y;
  uVar4 = (__return_storage_ptr__->upper).x;
  uVar9 = (__return_storage_ptr__->upper).y;
  (__return_storage_ptr__->lower).x = (float)uVar3 - fVar12;
  (__return_storage_ptr__->lower).y = (float)uVar8 - fVar12;
  (__return_storage_ptr__->lower).z = fVar13 - fVar12;
  (__return_storage_ptr__->upper).x = (float)uVar4 + fVar12;
  (__return_storage_ptr__->upper).y = (float)uVar9 + fVar12;
  (__return_storage_ptr__->upper).z = fVar12 + fVar15;
  return __return_storage_ptr__;
}

Assistant:

box3f Curve::getPrimBounds(const size_t /*unused: primID */) 
  {
    box3f primBounds = box3f::empty_box();
    for (auto p : P)
      primBounds.extend(p);
    vec3f maxWidth = vec3f(std::max(width0,width1));
    primBounds.lower = primBounds.lower - maxWidth;
    primBounds.upper = primBounds.upper + maxWidth;
    return primBounds;
  }